

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_print.cc
# Opt level: O0

int do_name_ex(BIO *out,X509_NAME *n,int indent,unsigned_long flags)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ASN1_OBJECT *o;
  ASN1_STRING *str;
  size_t sVar6;
  int objlen;
  int fn_nid;
  ASN1_STRING *val;
  ASN1_OBJECT *fn;
  X509_NAME_ENTRY *ent;
  int i;
  int cnt;
  int sep_eq_len;
  int sep_mv_len;
  int sep_dn_len;
  char *sep_eq;
  char *sep_mv;
  char *sep_dn;
  int len;
  int outlen;
  char *objbuf;
  char objtmp [80];
  int orflags;
  int prev;
  unsigned_long flags_local;
  int indent_local;
  X509_NAME *n_local;
  BIO *out_local;
  
  objtmp[0x4c] = -1;
  objtmp[0x4d] = -1;
  objtmp[0x4e] = -1;
  objtmp[0x4f] = -1;
  flags_local._4_4_ = indent;
  if (indent < 0) {
    flags_local._4_4_ = 0;
  }
  sep_dn._4_4_ = flags_local._4_4_;
  iVar2 = do_indent(out,flags_local._4_4_);
  if (iVar2 == 0) {
    out_local._4_4_ = -1;
  }
  else {
    uVar3 = (uint)flags & 0xf0000;
    if (uVar3 == 0x10000) {
      sep_mv = ",";
      sep_eq_len = 1;
      sep_eq = "+";
      cnt = 1;
      flags_local._4_4_ = 0;
    }
    else if (uVar3 == 0x20000) {
      sep_mv = ", ";
      sep_eq_len = 2;
      sep_eq = " + ";
      cnt = 3;
      flags_local._4_4_ = 0;
    }
    else if (uVar3 == 0x30000) {
      sep_mv = "; ";
      sep_eq_len = 2;
      sep_eq = " + ";
      cnt = 3;
      flags_local._4_4_ = 0;
    }
    else {
      if (uVar3 != 0x40000) {
        return -1;
      }
      sep_mv = "\n";
      sep_eq_len = 1;
      sep_eq = " + ";
      cnt = 3;
    }
    if ((flags & 0x800000) == 0) {
      _sep_mv_len = "=";
      i = 1;
    }
    else {
      _sep_mv_len = " = ";
      i = 3;
    }
    iVar2 = X509_NAME_entry_count((X509_NAME *)n);
    for (ent._4_4_ = 0; ent._4_4_ < iVar2; ent._4_4_ = ent._4_4_ + 1) {
      if ((flags & 0x100000) == 0) {
        fn = (ASN1_OBJECT *)X509_NAME_get_entry((X509_NAME *)n,ent._4_4_);
      }
      else {
        fn = (ASN1_OBJECT *)X509_NAME_get_entry((X509_NAME *)n,(iVar2 - ent._4_4_) + -1);
      }
      uVar1 = objtmp._76_4_;
      if (objtmp._76_4_ != -1) {
        iVar4 = X509_NAME_ENTRY_set((X509_NAME_ENTRY *)fn);
        if (uVar1 == iVar4) {
          iVar4 = maybe_write(out,sep_eq,cnt);
          if (iVar4 == 0) {
            return -1;
          }
          sep_dn._4_4_ = cnt + sep_dn._4_4_;
        }
        else {
          iVar4 = maybe_write(out,sep_mv,sep_eq_len);
          if (iVar4 == 0) {
            return -1;
          }
          iVar4 = do_indent(out,flags_local._4_4_);
          if (iVar4 == 0) {
            return -1;
          }
          sep_dn._4_4_ = flags_local._4_4_ + sep_eq_len + sep_dn._4_4_;
        }
      }
      objtmp._76_4_ = X509_NAME_ENTRY_set((X509_NAME_ENTRY *)fn);
      o = X509_NAME_ENTRY_get_object((X509_NAME_ENTRY *)fn);
      str = X509_NAME_ENTRY_get_data((X509_NAME_ENTRY *)fn);
      if ((flags & 0x600000) != 0) {
        __assert_fail("(flags & XN_FLAG_FN_MASK) == XN_FLAG_FN_SN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/name_print.cc"
                      ,0x83,"int do_name_ex(BIO *, const X509_NAME *, int, unsigned long)");
      }
      iVar4 = OBJ_obj2nid(o);
      if (iVar4 == 0) {
        OBJ_obj2txt((char *)&objbuf,0x50,o,1);
        _len = &objbuf;
      }
      else {
        _len = (char **)OBJ_nid2sn(iVar4);
      }
      sVar6 = strlen((char *)_len);
      iVar5 = maybe_write(out,_len,(int)sVar6);
      if ((iVar5 == 0) || (iVar5 = maybe_write(out,_sep_mv_len,i), iVar5 == 0)) {
        return -1;
      }
      if ((iVar4 == 0) && ((flags & 0x1000000) != 0)) {
        objtmp[0x48] = -0x80;
        objtmp[0x49] = '\0';
        objtmp[0x4a] = '\0';
        objtmp[0x4b] = '\0';
      }
      else {
        objtmp[0x48] = '\0';
        objtmp[0x49] = '\0';
        objtmp[0x4a] = '\0';
        objtmp[0x4b] = '\0';
      }
      iVar4 = ASN1_STRING_print_ex((BIO *)out,str,flags | (long)(int)objtmp._72_4_);
      if (iVar4 < 0) {
        return -1;
      }
      sep_dn._4_4_ = iVar4 + (int)sVar6 + i + sep_dn._4_4_;
    }
    out_local._4_4_ = sep_dn._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

static int do_name_ex(BIO *out, const X509_NAME *n, int indent,
                      unsigned long flags) {
  int prev = -1, orflags;
  char objtmp[80];
  const char *objbuf;
  int outlen, len;
  const char *sep_dn, *sep_mv, *sep_eq;
  int sep_dn_len, sep_mv_len, sep_eq_len;
  if (indent < 0) {
    indent = 0;
  }
  outlen = indent;
  if (!do_indent(out, indent)) {
    return -1;
  }
  switch (flags & XN_FLAG_SEP_MASK) {
    case XN_FLAG_SEP_MULTILINE:
      sep_dn = "\n";
      sep_dn_len = 1;
      sep_mv = " + ";
      sep_mv_len = 3;
      break;

    case XN_FLAG_SEP_COMMA_PLUS:
      sep_dn = ",";
      sep_dn_len = 1;
      sep_mv = "+";
      sep_mv_len = 1;
      indent = 0;
      break;

    case XN_FLAG_SEP_CPLUS_SPC:
      sep_dn = ", ";
      sep_dn_len = 2;
      sep_mv = " + ";
      sep_mv_len = 3;
      indent = 0;
      break;

    case XN_FLAG_SEP_SPLUS_SPC:
      sep_dn = "; ";
      sep_dn_len = 2;
      sep_mv = " + ";
      sep_mv_len = 3;
      indent = 0;
      break;

    default:
      return -1;
  }

  if (flags & XN_FLAG_SPC_EQ) {
    sep_eq = " = ";
    sep_eq_len = 3;
  } else {
    sep_eq = "=";
    sep_eq_len = 1;
  }

  int cnt = X509_NAME_entry_count(n);
  for (int i = 0; i < cnt; i++) {
    const X509_NAME_ENTRY *ent;
    if (flags & XN_FLAG_DN_REV) {
      ent = X509_NAME_get_entry(n, cnt - i - 1);
    } else {
      ent = X509_NAME_get_entry(n, i);
    }
    if (prev != -1) {
      if (prev == X509_NAME_ENTRY_set(ent)) {
        if (!maybe_write(out, sep_mv, sep_mv_len)) {
          return -1;
        }
        outlen += sep_mv_len;
      } else {
        if (!maybe_write(out, sep_dn, sep_dn_len)) {
          return -1;
        }
        outlen += sep_dn_len;
        if (!do_indent(out, indent)) {
          return -1;
        }
        outlen += indent;
      }
    }
    prev = X509_NAME_ENTRY_set(ent);
    const ASN1_OBJECT *fn = X509_NAME_ENTRY_get_object(ent);
    const ASN1_STRING *val = X509_NAME_ENTRY_get_data(ent);
    assert((flags & XN_FLAG_FN_MASK) == XN_FLAG_FN_SN);
    int fn_nid = OBJ_obj2nid(fn);
    if (fn_nid == NID_undef) {
      OBJ_obj2txt(objtmp, sizeof(objtmp), fn, 1);
      objbuf = objtmp;
    } else {
      objbuf = OBJ_nid2sn(fn_nid);
    }
    int objlen = strlen(objbuf);
    if (!maybe_write(out, objbuf, objlen) ||
        !maybe_write(out, sep_eq, sep_eq_len)) {
      return -1;
    }
    outlen += objlen + sep_eq_len;
    // If the field name is unknown then fix up the DER dump flag. We
    // might want to limit this further so it will DER dump on anything
    // other than a few 'standard' fields.
    if ((fn_nid == NID_undef) && (flags & XN_FLAG_DUMP_UNKNOWN_FIELDS)) {
      orflags = ASN1_STRFLGS_DUMP_ALL;
    } else {
      orflags = 0;
    }

    len = ASN1_STRING_print_ex(out, val, flags | orflags);
    if (len < 0) {
      return -1;
    }
    outlen += len;
  }
  return outlen;
}